

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cpp
# Opt level: O1

string * __thiscall
cali::util::demangle_abi_cxx11_(string *__return_storage_ptr__,util *this,char *name)

{
  char *pcVar1;
  char *__s;
  int status;
  int local_2c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (util *)0x0) {
    local_2c = -1;
    if ((*this == (util)0x5f) && (this[1] == (util)0x5a)) {
      __s = (char *)__cxa_demangle(this,0,0,&local_2c);
    }
    else {
      __s = (char *)0x0;
    }
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    if (local_2c == 0) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
    }
    else {
      strlen((char *)this);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)this);
    }
    free(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char* name)
{
#ifdef _WIN32
    // not sure how to demangle on Windows, make it a no-op for now.
    return name;
#else
    std::string result;

    if (!name)
        return result;

    char* demangled = nullptr;
    int   status    = -1;

    if (name[0] == '_' && name[1] == 'Z')
        demangled = abi::__cxa_demangle(name, nullptr, 0, &status);

    if (status == 0)
        result = demangled;
    else
        result = name;

    free(demangled);

    return result;
#endif
}